

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

p2sc_keyfile_t * p2sc_open_keyfile(char *file)

{
  int iVar1;
  p2sc_keyfile_t *ppVar2;
  char *pcVar3;
  GKeyFile *pGVar4;
  undefined8 in_RDI;
  p2sc_keyfile_t *k;
  GError *err;
  long local_10;
  undefined8 local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  ppVar2 = (p2sc_keyfile_t *)g_malloc(0x10);
  pcVar3 = (char *)g_strdup(local_8);
  ppVar2->name = pcVar3;
  pGVar4 = (GKeyFile *)g_key_file_new();
  ppVar2->key = pGVar4;
  iVar1 = g_key_file_load_from_file(ppVar2->key,ppVar2->name,0,&local_10);
  if ((iVar1 != 0) && (local_10 == 0)) {
    return ppVar2;
  }
  if ((local_10 != 0) && (*(long *)(local_10 + 8) != 0)) {
    _p2sc_msg("p2sc_open_keyfile",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x26,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,"%s: %s",ppVar2->name
              ,*(undefined8 *)(local_10 + 8));
    exit(1);
  }
  _p2sc_msg("p2sc_open_keyfile",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,0x29,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
            "%s: key file load failed - unknown reason",ppVar2->name);
  exit(1);
}

Assistant:

p2sc_keyfile_t *p2sc_open_keyfile(const char *file) {
    GError *err = NULL;
    p2sc_keyfile_t *k = (p2sc_keyfile_t *) g_malloc(sizeof *k);

    k->name = g_strdup(file);
    k->key = g_key_file_new();
    if (!g_key_file_load_from_file(k->key, k->name, (GKeyFileFlags) 0, &err) || err) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "%s: %s", k->name, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "%s: key file load failed - unknown reason", k->name);
        /* not reached */
        p2sc_free_keyfile(k);
        k = NULL;
    }
    return k;
}